

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32(Preprocessor *this,PragmaExpressionSyntax *expr)

{
  SyntaxKind SVar1;
  double value;
  _Optional_payload_base<unsigned_int> _Var2;
  ulong uVar3;
  SourceRange range;
  Token token;
  Token local_30;
  anon_class_16_2_3fdfa3b0 checkResult;
  
  SVar1 = (expr->super_SyntaxNode).kind;
  checkResult.this = this;
  checkResult.expr = expr;
  if (SVar1 == NumberPragmaExpression) {
    Token::intValue(&token);
    _Var2 = (_Optional_payload_base<unsigned_int>)
            requireUInt32::anon_class_16_2_3fdfa3b0::operator()(&checkResult,(SVInt *)&token);
    uVar3 = (ulong)_Var2 & 0xffffff0000000000;
    SVInt::~SVInt((SVInt *)&token);
    goto LAB_001ada34;
  }
  if (SVar1 == SimplePragmaExpression) {
    token._0_8_ = *(undefined8 *)&expr[1].super_SyntaxNode;
    token.info = (Info *)expr[1].super_SyntaxNode.parent;
    if (token.kind == RealLiteral) {
      value = Token::realValue(&token);
      SVInt::fromDouble((SVInt *)&local_30,0x20,value,true,true);
      _Var2 = (_Optional_payload_base<unsigned_int>)
              requireUInt32::anon_class_16_2_3fdfa3b0::operator()(&checkResult,(SVInt *)&local_30);
    }
    else {
      if (token.kind != IntegerLiteral) goto LAB_001ad998;
      Token::intValue(&local_30);
      _Var2 = (_Optional_payload_base<unsigned_int>)
              requireUInt32::anon_class_16_2_3fdfa3b0::operator()(&checkResult,(SVInt *)&local_30);
    }
    SVInt::~SVInt((SVInt *)&local_30);
    uVar3 = (ulong)_Var2 & 0xffffff0000000000;
  }
  else {
LAB_001ad998:
    range = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
    addDiag(this,(DiagCode)0x240004,range);
    uVar3 = 0;
    _Var2._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var2._M_engaged = false;
    _Var2._5_3_ = 0;
  }
LAB_001ada34:
  return (optional<unsigned_int>)((ulong)_Var2 & 0xffffffffff | uVar3);
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}